

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int writer(UI *ui,UI_STRING *uis)

{
  luaL_Buffer *in_RCX;
  size_t in_RDX;
  
  luaL_addlstring(in_RCX,(char *)uis,in_RDX);
  return 0;
}

Assistant:

static int writer (lua_State *L, const void *b, size_t size, void *ud) {
  struct str_Writer *state = (struct str_Writer *)ud;
  if (!state->init) {
    state->init = 1;
    luaL_buffinit(L, &state->B);
  }
  luaL_addlstring(&state->B, (const char *)b, size);
  return 0;
}